

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

wchar_t ego_item_name(char *buf,size_t buf_size,ego_desc *desc)

{
  short sVar1;
  ushort uVar2;
  ego_item *peVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  wchar_t wVar11;
  char prefix [100];
  char local_98 [104];
  
  peVar3 = e_info;
  sVar1 = desc->e_idx;
  uVar2 = desc->itype;
  uVar9 = 0x1a;
  if ((ulong)uVar2 < 0x1a) {
    uVar9 = (uint)uVar2;
  }
  uVar7 = 0;
  do {
    uVar10 = uVar9;
    if (uVar2 == uVar7) break;
    uVar7 = uVar7 + 1;
    uVar10 = uVar9 + 1;
  } while (uVar7 != 0x1b);
  wVar11 = L'\0';
  if (uVar10 != 0x1b) {
    sVar4 = my_strcat(buf,"[ ] ",buf_size);
    sVar5 = my_strcat(buf,*(char **)((long)&quality_choices[0].name + (ulong)(uVar10 << 4)),buf_size
                     );
    sVar6 = my_strcat(buf," ",buf_size);
    wVar11 = (int)sVar6 + (int)sVar4 + (int)sVar5;
    lVar8 = (long)desc->short_name - (long)peVar3[sVar1].name;
    if (lVar8 != 0) {
      my_strcpy(local_98,peVar3[sVar1].name,lVar8 + 1);
      sVar4 = my_strcat(buf,local_98,buf_size);
      wVar11 = wVar11 + (int)sVar4;
    }
  }
  return wVar11;
}

Assistant:

int ego_item_name(char *buf, size_t buf_size, struct ego_desc *desc)
{
	size_t i;
	int end;
	size_t prefix_size;
	const char *long_name;

	struct ego_item *ego = &e_info[desc->e_idx];

	/* Find the ignore type */
	for (i = 0; i < N_ELEMENTS(quality_choices); i++)
		if (desc->itype == i) break;

	if (i == N_ELEMENTS(quality_choices)) return 0;

	/* Initialize the buffer */
	end = my_strcat(buf, "[ ] ", buf_size);

	/* Append the name */
	end += my_strcat(buf, quality_choices[i].name, buf_size);

	/* Append an extra space */
	end += my_strcat(buf, " ", buf_size);

	/* Get the full ego-item name */
	long_name = ego->name;

	/* Get the length of the common prefix, if any */
	prefix_size = (desc->short_name - long_name);

	/* Found a prefix? */
	if (prefix_size > 0) {
		char prefix[100];

		/* Get a copy of the prefix */
		my_strcpy(prefix, long_name, prefix_size + 1);

		/* Append the prefix */
		end += my_strcat(buf, prefix, buf_size);
	}
	/* Set the name to the right length */
	return end;
}